

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaOf.c
# Opt level: O2

void Of_ObjMergeOrder(Of_Man_t *p,int iObj)

{
  int *pCut;
  long lVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  Of_Cut_t *pCut_00;
  Vec_Mem_t *pVVar4;
  ulong uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined4 uVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  uint nCuts;
  uint uVar13;
  uint uVar14;
  Gia_Obj_t *pObj;
  ulong uVar15;
  Gia_Obj_t *pGVar16;
  long lVar17;
  word *pwVar18;
  word wVar19;
  word wVar20;
  word wVar21;
  ulong uVar22;
  void *pvVar23;
  uint *puVar24;
  ulong uVar25;
  int iVar26;
  Of_Cut_t *pOVar27;
  int *piVar28;
  uint uVar29;
  uint uVar30;
  uint uVar31;
  int iVar32;
  uint uVar33;
  int iVar34;
  uint uVar35;
  Of_Cut_t *pOVar36;
  uint uVar37;
  Of_Cut_t *pOVar38;
  Gia_Man_t *p_00;
  int iVar39;
  int *piVar40;
  long lVar41;
  bool bVar42;
  bool bVar43;
  int local_1984;
  ulong local_1968;
  uint local_195c;
  Of_Cut_t *local_1958;
  ulong local_1950;
  ulong local_1948;
  Of_Cut_t *local_1940;
  Of_Cut_t *pCutsR [32];
  Of_Cut_t pCuts2 [32];
  Of_Cut_t pCuts0 [32];
  Of_Cut_t pCuts1 [32];
  Of_Cut_t pCuts [32];
  
  pObj = Gia_ManObj(p->pGia,iObj);
  iVar26 = p->pGia->pRefs[iObj];
  uVar29 = p->pPars->nLutSize;
  uVar22 = (ulong)uVar29;
  uVar14 = p->pPars->nCutNum;
  iVar9 = Of_ManPrepareCuts(pCuts0,p,iObj - (*(uint *)pObj & 0x1fffffff),1);
  iVar10 = Of_ManPrepareCuts(pCuts1,p,iObj - (*(uint *)&pObj->field_0x4 & 0x1fffffff),1);
  p_00 = p->pGia;
  piVar40 = p_00->pSibls;
  if (piVar40 == (int *)0x0) {
    iVar12 = 0;
  }
  else {
    iVar12 = piVar40[iObj];
  }
  uVar15 = *(ulong *)pObj;
  iVar11 = Gia_ObjIsBuf(pObj);
  if (iVar11 != 0) {
    __assert_fail("!Gia_ObjIsBuf(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaOf.c"
                  ,0x2ba,"void Of_ObjMergeOrder(Of_Man_t *, int)");
  }
  iVar26 = iVar26 * 2;
  local_1948 = (ulong)((uint)(uVar15 >> 0x1d) & 1);
  local_1950 = (ulong)((uint)(uVar15 >> 0x3d) & 1);
  local_1958 = pCuts0 + iVar9;
  local_1940 = pCuts1 + iVar10;
  uVar15 = 0;
  uVar25 = 0;
  if (0 < (int)uVar14) {
    uVar25 = (ulong)uVar14;
  }
  pOVar27 = pCuts;
  for (; uVar25 != uVar15; uVar15 = uVar15 + 1) {
    pCutsR[uVar15] = pOVar27;
    pOVar27 = pOVar27 + 1;
  }
  if (iVar12 == 0) {
    nCuts = 0;
  }
  else {
    pGVar16 = Gia_ManObj(p_00,piVar40[iObj]);
    uVar2 = *(undefined8 *)pGVar16;
    uVar3 = *(undefined8 *)pObj;
    pOVar27 = pCuts2;
    nCuts = 0;
    iVar12 = Of_ManPrepareCuts(pOVar27,p,iVar12,0);
    for (; pOVar27 < pCuts2 + iVar12; pOVar27 = pOVar27 + 1) {
      pOVar36 = pCutsR[(int)nCuts];
      wVar19 = pOVar27->Sign;
      iVar32 = pOVar27->Delay;
      iVar34 = pOVar27->Flow;
      uVar8 = *(undefined4 *)&pOVar27->field_0x10;
      iVar11 = pOVar27->pLeaves[0];
      uVar6 = *(undefined8 *)(pOVar27->pLeaves + 1);
      uVar7 = *(undefined8 *)(pOVar27->pLeaves + 5);
      *(undefined8 *)(pOVar36->pLeaves + 3) = *(undefined8 *)(pOVar27->pLeaves + 3);
      *(undefined8 *)(pOVar36->pLeaves + 5) = uVar7;
      *(undefined4 *)&pOVar36->field_0x10 = uVar8;
      pOVar36->pLeaves[0] = iVar11;
      *(undefined8 *)(pOVar36->pLeaves + 1) = uVar6;
      pOVar36->Sign = wVar19;
      pOVar36->Delay = iVar32;
      pOVar36->Flow = iVar34;
      if (p->pPars->fCutMin != 0) {
        *(uint *)&pOVar36->field_0x10 =
             *(uint *)&pOVar36->field_0x10 & 0xf8000000 |
             *(uint *)&pOVar36->field_0x10 & 0x7ffffff ^
             ((uint)((ulong)uVar2 >> 0x20) ^ (uint)((ulong)uVar3 >> 0x20)) >> 0x1f;
      }
      Of_CutParams(p,pOVar36,iVar26);
      nCuts = Of_SetAddCut(pCutsR,nCuts,uVar14);
    }
    p_00 = p->pGia;
  }
  if ((p_00->pMuxes == (uint *)0x0) || (uVar33 = p_00->pMuxes[iObj], uVar33 == 0)) {
    uVar2 = *(undefined8 *)pObj;
    uVar33 = (uint)uVar2;
    p->CutCount[0] = (double)(iVar10 * iVar9) + p->CutCount[0];
    piVar40 = pCuts0[0].pLeaves;
    for (pOVar27 = pCuts0; pOVar27 < local_1958; pOVar27 = pOVar27 + 1) {
      for (pOVar36 = pCuts1; pOVar36 < local_1940; pOVar36 = pOVar36 + 1) {
        uVar13 = *(uint *)&pOVar27->field_0x10;
        uVar35 = uVar13 >> 0x1b;
        uVar30 = *(uint *)&pOVar36->field_0x10;
        uVar37 = uVar30 >> 0x1b;
        if (((int)uVar29 < (int)(uVar37 + uVar35)) &&
           (uVar15 = pOVar36->Sign | pOVar27->Sign,
           uVar15 = uVar15 - (uVar15 >> 1 & 0x5555555555555555),
           uVar15 = (uVar15 >> 2 & 0x3333333333333333) + (uVar15 & 0x3333333333333333),
           (int)uVar29 <
           (int)(uint)(byte)(((uVar15 >> 4) + uVar15 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >>
                            0x38))) goto LAB_006113a4;
        p->CutCount[1] = p->CutCount[1] + 1.0;
        pOVar38 = pCutsR[(int)nCuts];
        pCut = pOVar38->pLeaves;
        if ((uVar35 == uVar29) && (uVar37 == uVar29)) {
          for (uVar15 = 0; uVar31 = uVar29, uVar22 != uVar15; uVar15 = uVar15 + 1) {
            if (piVar40[uVar15] != pOVar36->pLeaves[uVar15]) goto LAB_006113a4;
            pCut[uVar15] = piVar40[uVar15];
          }
LAB_00611027:
          *(uint *)&pOVar38->field_0x10 = uVar31 << 0x1b | 0x7ffffff;
          pOVar38->Sign = pOVar36->Sign | pOVar27->Sign;
          iVar9 = Of_SetLastCutIsContained(pCutsR,nCuts);
          if (iVar9 == 0) {
            p->CutCount[2] = p->CutCount[2] + 1.0;
            if (p->pPars->fCutMin != 0) {
              uVar13 = *(uint *)&pOVar38->field_0x10;
              pVVar4 = p->vTtMem;
              iVar9 = Abc_Lit2Var(*(uint *)&pOVar27->field_0x10 & 0x7ffffff);
              pwVar18 = Vec_MemReadEntry(pVVar4,iVar9);
              uVar15 = *pwVar18;
              pVVar4 = p->vTtMem;
              iVar9 = Abc_Lit2Var(*(uint *)&pOVar36->field_0x10 & 0x7ffffff);
              pwVar18 = Vec_MemReadEntry(pVVar4,iVar9);
              uVar25 = *pwVar18;
              iVar9 = Abc_LitIsCompl(*(uint *)&pOVar27->field_0x10 & 0x7ffffff);
              bVar42 = iVar9 != (int)local_1948;
              iVar9 = Abc_LitIsCompl(*(uint *)&pOVar36->field_0x10 & 0x7ffffff);
              bVar43 = iVar9 != (int)local_1950;
              wVar19 = Abc_Tt6Expand(-(ulong)bVar42 ^ uVar15,pOVar27->pLeaves,
                                     *(uint *)&pOVar27->field_0x10 >> 0x1b,pCut,
                                     *(uint *)&pOVar38->field_0x10 >> 0x1b);
              wVar20 = Abc_Tt6Expand(-(ulong)bVar43 ^ uVar25,pOVar36->pLeaves,
                                     *(uint *)&pOVar36->field_0x10 >> 0x1b,pCut,
                                     *(uint *)&pOVar38->field_0x10 >> 0x1b);
              uVar15 = wVar20 & wVar19;
              if (((~uVar33 & 0x1fffffff) != 0 && -1 < (int)uVar33) &&
                  (uVar33 & 0x1fffffff) < ((uint)((ulong)uVar2 >> 0x20) & 0x1fffffff)) {
                uVar15 = wVar20 ^ wVar19;
              }
              pCuts2[0].Sign = -(ulong)((uint)uVar15 & 1) ^ uVar15;
              iVar9 = Abc_Tt6MinBase(&pCuts2[0].Sign,pCut,*(uint *)&pOVar38->field_0x10 >> 0x1b);
              *(uint *)&pOVar38->field_0x10 =
                   *(uint *)&pOVar38->field_0x10 & 0x7ffffff | iVar9 << 0x1b;
              if ((pCuts2[0].Sign & 1) != 0) {
                __assert_fail("(int)(t & 1) == 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaOf.c"
                              ,0x120,
                              "int Of_CutComputeTruth6(Of_Man_t *, Of_Cut_t *, Of_Cut_t *, int, int, Of_Cut_t *, int)"
                             );
              }
              uVar13 = uVar13 >> 0x1b;
              iVar9 = Vec_MemHashInsert(p->vTtMem,&pCuts2[0].Sign);
              uVar35 = Abc_Var2Lit(iVar9,(uint)uVar15 & 1);
              uVar30 = *(uint *)&pOVar38->field_0x10;
              *(uint *)&pOVar38->field_0x10 = uVar30 & 0xf8000000 | uVar35 & 0x7ffffff;
              uVar30 = uVar30 >> 0x1b;
              if (uVar13 < uVar30) {
                __assert_fail("(int)pCutR->nLeaves <= nOldSupp",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaOf.c"
                              ,0x123,
                              "int Of_CutComputeTruth6(Of_Man_t *, Of_Cut_t *, Of_Cut_t *, int, int, Of_Cut_t *, int)"
                             );
              }
              if (uVar30 < uVar13) {
                wVar19 = Of_CutGetSign(pCut,uVar30);
                pOVar38->Sign = wVar19;
              }
            }
            Of_CutParams(p,pOVar38,iVar26);
            nCuts = Of_SetAddCut(pCutsR,nCuts,uVar14);
          }
        }
        else {
          iVar9 = 0;
          uVar31 = 0;
          if (uVar13 < 0x8000000) {
LAB_00610fef:
            if ((int)(uVar31 + uVar37) <= (int)(iVar9 + uVar29)) {
              piVar28 = pOVar38->pLeaves + (int)uVar31;
              for (lVar17 = (long)iVar9; lVar17 < (long)(ulong)uVar37; lVar17 = lVar17 + 1) {
                *piVar28 = pOVar36->pLeaves[lVar17];
                uVar31 = uVar31 + 1;
                piVar28 = piVar28 + 1;
              }
              goto LAB_00611027;
            }
          }
          else {
            iVar10 = 0;
            uVar31 = 0;
            if (0x7ffffff < uVar30) {
              iVar9 = 0;
              uVar15 = 0;
              lVar17 = 0;
              do {
                while( true ) {
                  iVar10 = (int)uVar15;
                  lVar41 = 0;
                  while( true ) {
                    if (uVar22 - lVar17 == lVar41) goto LAB_006113a4;
                    iVar12 = piVar40[iVar10 + lVar41];
                    iVar11 = pOVar36->pLeaves[iVar9];
                    iVar34 = (int)lVar41;
                    iVar32 = (int)lVar17;
                    if (iVar11 <= iVar12) break;
                    pCut[lVar17 + lVar41] = iVar12;
                    lVar41 = lVar41 + 1;
                    if ((int)uVar35 <= (int)lVar41 + iVar10) goto LAB_006113b2;
                  }
                  lVar1 = lVar17 + 1 + lVar41;
                  if (iVar12 <= iVar11) break;
                  iVar9 = iVar9 + 1;
                  pCut[lVar17 + lVar41] = iVar11;
                  if ((int)uVar37 <= iVar9) {
                    iVar10 = iVar10 + iVar34;
                    goto LAB_006113d5;
                  }
                  uVar15 = (ulong)(uint)(iVar10 + iVar34);
                  lVar17 = lVar1;
                }
                uVar15 = (uVar15 & 0xffffffff) + lVar41 + 1;
                pCut[lVar17 + lVar41] = iVar12;
                iVar9 = iVar9 + 1;
                if ((int)uVar35 <= (int)uVar15) {
LAB_006113b2:
                  uVar31 = iVar32 + iVar34 + 1;
                  goto LAB_00610fef;
                }
                lVar17 = lVar1;
              } while (iVar9 < (int)uVar37);
              iVar10 = iVar10 + iVar34 + 1;
LAB_006113d5:
              uVar31 = iVar32 + iVar34 + 1;
            }
            if ((int)(uVar31 + uVar35) <= (int)(iVar10 + uVar29)) {
              piVar28 = pOVar38->pLeaves + (int)uVar31;
              for (lVar17 = (long)iVar10; lVar17 < (long)(ulong)uVar35; lVar17 = lVar17 + 1) {
                *piVar28 = piVar40[lVar17];
                uVar31 = uVar31 + 1;
                piVar28 = piVar28 + 1;
              }
              goto LAB_00611027;
            }
          }
        }
LAB_006113a4:
      }
      piVar40 = piVar40 + 0xc;
    }
  }
  else {
    iVar12 = Abc_Lit2Var(uVar33);
    iVar12 = Of_ManPrepareCuts(pCuts2,p,iVar12,1);
    puVar24 = p->pGia->pMuxes;
    if (puVar24 == (uint *)0x0) {
      local_1984 = 0;
    }
    else {
      iVar11 = Gia_ObjId(p->pGia,pObj);
      local_1984 = Abc_LitIsCompl(puVar24[iVar11]);
    }
    p->CutCount[0] = (double)(iVar12 * iVar10 * iVar9) + p->CutCount[0];
    for (pOVar27 = pCuts0; pOVar27 < local_1958; pOVar27 = pOVar27 + 1) {
      for (pOVar36 = pCuts1; pOVar36 < local_1940; pOVar36 = pOVar36 + 1) {
        for (pOVar38 = pCuts2; pOVar38 < pCuts2 + iVar12; pOVar38 = pOVar38 + 1) {
          uVar15 = pOVar36->Sign | pOVar27->Sign | pOVar38->Sign;
          uVar15 = uVar15 - (uVar15 >> 1 & 0x5555555555555555);
          uVar15 = (uVar15 >> 2 & 0x3333333333333333) + (uVar15 & 0x3333333333333333);
          if ((int)(uint)(byte)(((uVar15 >> 4) + uVar15 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >>
                               0x38) <= (int)uVar29) {
            p->CutCount[1] = p->CutCount[1] + 1.0;
            pCut_00 = pCutsR[(int)nCuts];
            uVar33 = *(uint *)&pOVar27->field_0x10;
            uVar13 = *(uint *)&pOVar36->field_0x10;
            uVar30 = *(uint *)&pOVar38->field_0x10;
            piVar40 = pCut_00->pLeaves;
            uVar15 = 0;
            iVar9 = 0x7ffffff;
            uVar35 = 0;
            uVar37 = 0;
            uVar25 = 0;
            while( true ) {
              iVar11 = 1000000000;
              iVar10 = 1000000000;
              if ((uint)uVar25 != uVar33 >> 0x1b) {
                iVar10 = pOVar27->pLeaves[uVar25];
              }
              if (uVar37 != uVar13 >> 0x1b) {
                iVar11 = pOVar36->pLeaves[uVar37];
              }
              iVar32 = 1000000000;
              if (uVar35 != uVar30 >> 0x1b) {
                iVar32 = pOVar38->pLeaves[uVar35];
              }
              iVar34 = iVar11;
              if (iVar10 < iVar11) {
                iVar34 = iVar10;
              }
              iVar39 = iVar32;
              if (iVar34 < iVar32) {
                iVar39 = iVar34;
              }
              if (iVar39 == 1000000000) break;
              if (uVar22 == uVar15) goto LAB_00611900;
              pCut_00->pLeaves[uVar15] = iVar39;
              uVar15 = uVar15 + 1;
              uVar25 = (ulong)((uint)uVar25 + (uint)(iVar10 == iVar39));
              uVar37 = uVar37 + (iVar11 == iVar39);
              uVar35 = uVar35 + (iVar32 <= iVar34);
              iVar9 = iVar9 + 0x8000000;
            }
            *(int *)&pCut_00->field_0x10 = iVar9;
            pCut_00->Sign = pOVar36->Sign | pOVar27->Sign | pOVar38->Sign;
            iVar9 = Of_SetLastCutIsContained(pCutsR,nCuts);
            if (iVar9 == 0) {
              p->CutCount[2] = p->CutCount[2] + 1.0;
              if (p->pPars->fCutMin != 0) {
                local_195c = *(uint *)&pCut_00->field_0x10;
                pVVar4 = p->vTtMem;
                iVar9 = Abc_Lit2Var(*(uint *)&pOVar27->field_0x10 & 0x7ffffff);
                pwVar18 = Vec_MemReadEntry(pVVar4,iVar9);
                uVar15 = *pwVar18;
                pVVar4 = p->vTtMem;
                iVar9 = Abc_Lit2Var(*(uint *)&pOVar36->field_0x10 & 0x7ffffff);
                pwVar18 = Vec_MemReadEntry(pVVar4,iVar9);
                uVar25 = *pwVar18;
                pVVar4 = p->vTtMem;
                iVar9 = Abc_Lit2Var(*(uint *)&pOVar38->field_0x10 & 0x7ffffff);
                pwVar18 = Vec_MemReadEntry(pVVar4,iVar9);
                uVar5 = *pwVar18;
                iVar9 = Abc_LitIsCompl(*(uint *)&pOVar27->field_0x10 & 0x7ffffff);
                bVar42 = iVar9 != (int)local_1948;
                iVar9 = Abc_LitIsCompl(*(uint *)&pOVar36->field_0x10 & 0x7ffffff);
                bVar43 = iVar9 != (int)local_1950;
                iVar9 = Abc_LitIsCompl(*(uint *)&pOVar38->field_0x10 & 0x7ffffff);
                wVar19 = Abc_Tt6Expand(-(ulong)bVar42 ^ uVar15,pOVar27->pLeaves,
                                       *(uint *)&pOVar27->field_0x10 >> 0x1b,piVar40,
                                       *(uint *)&pCut_00->field_0x10 >> 0x1b);
                wVar20 = Abc_Tt6Expand(-(ulong)bVar43 ^ uVar25,pOVar36->pLeaves,
                                       *(uint *)&pOVar36->field_0x10 >> 0x1b,piVar40,
                                       *(uint *)&pCut_00->field_0x10 >> 0x1b);
                wVar21 = Abc_Tt6Expand(-(ulong)(iVar9 != local_1984) ^ uVar5,pOVar38->pLeaves,
                                       *(uint *)&pOVar38->field_0x10 >> 0x1b,piVar40,
                                       *(uint *)&pCut_00->field_0x10 >> 0x1b);
                local_1968 = (wVar20 ^ wVar19) & wVar21 ^ wVar19;
                uVar33 = (uint)local_1968;
                local_1968 = -(ulong)(uVar33 & 1) ^ local_1968;
                iVar9 = Abc_Tt6MinBase(&local_1968,piVar40,*(uint *)&pCut_00->field_0x10 >> 0x1b);
                *(uint *)&pCut_00->field_0x10 =
                     *(uint *)&pCut_00->field_0x10 & 0x7ffffff | iVar9 << 0x1b;
                if ((local_1968 & 1) != 0) {
                  __assert_fail("(int)(t & 1) == 0",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaOf.c"
                                ,0x135,
                                "int Of_CutComputeTruthMux6(Of_Man_t *, Of_Cut_t *, Of_Cut_t *, Of_Cut_t *, int, int, int, Of_Cut_t *)"
                               );
                }
                uVar30 = local_195c >> 0x1b;
                iVar9 = Vec_MemHashInsert(p->vTtMem,&local_1968);
                uVar13 = Abc_Var2Lit(iVar9,uVar33 & 1);
                uVar33 = *(uint *)&pCut_00->field_0x10;
                *(uint *)&pCut_00->field_0x10 = uVar33 & 0xf8000000 | uVar13 & 0x7ffffff;
                uVar33 = uVar33 >> 0x1b;
                if (uVar30 < uVar33) {
                  __assert_fail("(int)pCutR->nLeaves <= nOldSupp",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaOf.c"
                                ,0x138,
                                "int Of_CutComputeTruthMux6(Of_Man_t *, Of_Cut_t *, Of_Cut_t *, Of_Cut_t *, int, int, int, Of_Cut_t *)"
                               );
                }
                if (uVar33 < uVar30) {
                  wVar19 = Of_CutGetSign(piVar40,uVar33);
                  pCut_00->Sign = wVar19;
                }
              }
              Of_CutParams(p,pCut_00,iVar26);
              nCuts = Of_SetAddCut(pCutsR,nCuts,uVar14);
            }
          }
LAB_00611900:
        }
      }
    }
  }
  if ((0 < (int)nCuts) && ((int)nCuts < (int)uVar14)) {
    Vec_IntWriteEntry(&p->vCutFlows,iObj,pCutsR[0]->Flow);
    Vec_IntWriteEntry(&p->vCutDelays,iObj,pCutsR[0]->Delay);
    iVar26 = 1;
    for (uVar22 = 0; nCuts != uVar22; uVar22 = uVar22 + 1) {
      iVar26 = iVar26 + (*(uint *)&pCutsR[uVar22]->field_0x10 >> 0x1b) + 4;
    }
    uVar29 = p->iCur;
    if (0xffff < (uVar29 & 0xffff) + iVar26) {
      uVar29 = (uVar29 & 0xffff0000) + 0x10000;
      p->iCur = uVar29;
    }
    iVar9 = (p->vPages).nSize;
    if (iVar9 == (int)uVar29 >> 0x10) {
      pvVar23 = calloc(0x10000,4);
      if (iVar9 == (p->vPages).nCap) {
        iVar10 = 0x10;
        if (0xf < iVar9) {
          iVar10 = iVar9 * 2;
        }
        Vec_PtrGrow(&p->vPages,iVar10);
        iVar9 = (p->vPages).nSize;
        uVar29 = p->iCur;
      }
      (p->vPages).nSize = iVar9 + 1;
      (p->vPages).pArray[iVar9] = pvVar23;
    }
    p->iCur = iVar26 + uVar29;
    puVar24 = (uint *)Of_ManCutSet(p,uVar29);
    *puVar24 = nCuts;
    puVar24 = puVar24 + 1;
    for (uVar22 = 0; nCuts != uVar22; uVar22 = uVar22 + 1) {
      pOVar27 = pCutsR[uVar22];
      *puVar24 = *(uint *)&pOVar27->field_0x10 << 5 | *(uint *)&pOVar27->field_0x10 >> 0x1b;
      memcpy(puVar24 + 1,pOVar27->pLeaves,
             (ulong)(*(uint *)&pOVar27->field_0x10 >> 0x19 & 0xfffffffc));
      uVar14 = *(uint *)&pOVar27->field_0x10 >> 0x1b;
      (puVar24 + (ulong)uVar14 + 1)[0] = 0xffffffff;
      (puVar24 + (ulong)uVar14 + 1)[1] = 0xffffffff;
      puVar24[(ulong)uVar14 + 3] = 0xffffffff;
      puVar24 = puVar24 + (ulong)uVar14 + 4;
    }
    puVar24 = (uint *)Vec_IntEntryP(&p->vCutSets,iObj);
    *puVar24 = uVar29;
    p->CutCount[3] = (double)(int)nCuts + p->CutCount[3];
    return;
  }
  __assert_fail("nCutsR > 0 && nCutsR < nCutNum",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaOf.c"
                ,0x304,"void Of_ObjMergeOrder(Of_Man_t *, int)");
}

Assistant:

void Of_ObjMergeOrder( Of_Man_t * p, int iObj )
{
    Of_Cut_t pCuts0[OF_CUT_MAX], pCuts1[OF_CUT_MAX], pCuts[OF_CUT_MAX], * pCutsR[OF_CUT_MAX];
    Gia_Obj_t * pObj = Gia_ManObj(p->pGia, iObj);
    int nGiaRefs = 2*Gia_ObjRefNumId(p->pGia, iObj);
    int nLutSize = p->pPars->nLutSize;
    int nCutNum  = p->pPars->nCutNum;
    int nCuts0   = Of_ManPrepareCuts(pCuts0, p, Gia_ObjFaninId0(pObj, iObj), 1);
    int nCuts1   = Of_ManPrepareCuts(pCuts1, p, Gia_ObjFaninId1(pObj, iObj), 1);
    int fComp0   = Gia_ObjFaninC0(pObj);
    int fComp1   = Gia_ObjFaninC1(pObj);
    int iSibl    = Gia_ObjSibl(p->pGia, iObj);
    Of_Cut_t * pCut0, * pCut1, * pCut0Lim = pCuts0 + nCuts0, * pCut1Lim = pCuts1 + nCuts1;
    int i, nCutsR = 0;
    assert( !Gia_ObjIsBuf(pObj) );
    for ( i = 0; i < nCutNum; i++ )
        pCutsR[i] = pCuts + i;
    if ( iSibl )
    {
        Of_Cut_t pCuts2[OF_CUT_MAX];
        Gia_Obj_t * pObjE = Gia_ObjSiblObj(p->pGia, iObj);
        int fCompE = Gia_ObjPhase(pObj) ^ Gia_ObjPhase(pObjE);
        int nCuts2 = Of_ManPrepareCuts(pCuts2, p, iSibl, 0);
        Of_Cut_t * pCut2, * pCut2Lim = pCuts2 + nCuts2;
        for ( pCut2 = pCuts2; pCut2 < pCut2Lim; pCut2++ )
        {
            *pCutsR[nCutsR] = *pCut2;
            if ( p->pPars->fCutMin )
                pCutsR[nCutsR]->iFunc = Abc_LitNotCond( pCutsR[nCutsR]->iFunc, fCompE );
            Of_CutParams( p, pCutsR[nCutsR], nGiaRefs );
            nCutsR = Of_SetAddCut( pCutsR, nCutsR, nCutNum );
        }
    }
    if ( Gia_ObjIsMuxId(p->pGia, iObj) )
    {
        Of_Cut_t pCuts2[OF_CUT_MAX];
        int nCuts2  = Of_ManPrepareCuts(pCuts2, p, Gia_ObjFaninId2(p->pGia, iObj), 1);
        int fComp2  = Gia_ObjFaninC2(p->pGia, pObj);
        Of_Cut_t * pCut2, * pCut2Lim = pCuts2 + nCuts2;
        p->CutCount[0] += nCuts0 * nCuts1 * nCuts2;
        for ( pCut0 = pCuts0; pCut0 < pCut0Lim; pCut0++ )
        for ( pCut1 = pCuts1; pCut1 < pCut1Lim; pCut1++ )
        for ( pCut2 = pCuts2; pCut2 < pCut2Lim; pCut2++ )
        {
            if ( Of_CutCountBits(pCut0->Sign | pCut1->Sign | pCut2->Sign) > nLutSize )
                continue;
            p->CutCount[1]++; 
            if ( !Of_CutMergeOrderMux(pCut0, pCut1, pCut2, pCutsR[nCutsR], nLutSize) )
                continue;
            if ( Of_SetLastCutIsContained(pCutsR, nCutsR) )
                continue;
            p->CutCount[2]++;
            if ( p->pPars->fCutMin && Of_CutComputeTruthMux6(p, pCut0, pCut1, pCut2, fComp0, fComp1, fComp2, pCutsR[nCutsR]) )
                pCutsR[nCutsR]->Sign = Of_CutGetSign(pCutsR[nCutsR]->pLeaves, pCutsR[nCutsR]->nLeaves);
            Of_CutParams( p, pCutsR[nCutsR], nGiaRefs );
            nCutsR = Of_SetAddCut( pCutsR, nCutsR, nCutNum );
        }
    }
    else
    {
        int fIsXor = Gia_ObjIsXor(pObj);
        p->CutCount[0] += nCuts0 * nCuts1;
        for ( pCut0 = pCuts0; pCut0 < pCut0Lim; pCut0++ )
        for ( pCut1 = pCuts1; pCut1 < pCut1Lim; pCut1++ )
        {
            if ( (int)(pCut0->nLeaves + pCut1->nLeaves) > nLutSize && Of_CutCountBits(pCut0->Sign | pCut1->Sign) > nLutSize )
                continue;
            p->CutCount[1]++; 
            if ( !Of_CutMergeOrder(pCut0, pCut1, pCutsR[nCutsR], nLutSize) )
                continue;
            if ( Of_SetLastCutIsContained(pCutsR, nCutsR) )
                continue;
            p->CutCount[2]++;
            if ( p->pPars->fCutMin && Of_CutComputeTruth6(p, pCut0, pCut1, fComp0, fComp1, pCutsR[nCutsR], fIsXor) )
                pCutsR[nCutsR]->Sign = Of_CutGetSign(pCutsR[nCutsR]->pLeaves, pCutsR[nCutsR]->nLeaves);
            Of_CutParams( p, pCutsR[nCutsR], nGiaRefs );
            nCutsR = Of_SetAddCut( pCutsR, nCutsR, nCutNum );
        }
    }
    // debug printout
    if ( 0 )
    {
        printf( "*** Obj = %d\n", iObj );
        for ( i = 0; i < nCutsR; i++ )
            Of_Cutprintf( p, pCutsR[i] );
        printf( "\n" );
    } 
    // verify
    assert( nCutsR > 0 && nCutsR < nCutNum );
    //assert( Of_SetCheckArray(pCutsR, nCutsR) );
    // store the cutset
    Of_ObjSetCutFlow( p, iObj, pCutsR[0]->Flow );
    Of_ObjSetCutDelay( p, iObj, pCutsR[0]->Delay );
    *Vec_IntEntryP(&p->vCutSets, iObj) = Of_ManSaveCuts(p, pCutsR, nCutsR);
    p->CutCount[3] += nCutsR;
}